

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O2

qpdf_offset_t __thiscall InputSource::fastTell(InputSource *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  if (this->buf_len != 0) {
    iVar2 = (*this->_vptr_InputSource[4])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    lVar1 = this->buf_start;
    if ((lVar1 <= lVar3) && (lVar3 < lVar1 + this->buf_len)) {
      this->last_offset = lVar3;
      this->buf_idx = lVar3 - lVar1;
      goto LAB_001b0ed3;
    }
  }
  loadBuffer(this);
LAB_001b0ed3:
  return this->last_offset;
}

Assistant:

inline qpdf_offset_t
InputSource::fastTell()
{
    if (buf_len == 0) {
        loadBuffer();
    } else {
        auto curr = tell();
        if (curr < buf_start || curr >= (buf_start + buf_len)) {
            loadBuffer();
        } else {
            last_offset = curr;
            buf_idx = curr - buf_start;
        }
    }
    return last_offset;
}